

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1539::run(TestCase1539 *this)

{
  size_t sVar1;
  char cVar2;
  uint i;
  uint uVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  MessageSizeCounts MVar5;
  ReaderOptions options;
  Runnable local_408;
  ReaderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>_>
  *local_400;
  Reader root;
  BuilderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct>_>_> listList;
  Fault f;
  SegmentArrayMessageReader reader;
  ReaderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>_>
  listListReader;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&f,&builder.super_MessageBuilder);
  reader.super_MessageReader._vptr_MessageReader = (_func_int **)f.exception;
  AnyPointer::Builder::
  initAs<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct,(capnp::Kind)3>,(capnp::Kind)6>>
            (&listList,(Builder *)&reader,500);
  for (uVar3 = 0; uVar3 < listList.builder.elementCount; uVar3 = uVar3 + 1) {
    List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::Builder::init((Builder *)&f,(EVP_PKEY_CTX *)&listList);
  }
  AVar4 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((_func_int **)AVar4.size_ != (_func_int **)0x1) {
    root._reader.segment._0_4_ = 1;
    reader.super_MessageReader._vptr_MessageReader = (_func_int **)AVar4.size_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60d,FAILED,"(1) == (segments.size())","1, segments.size()",(int *)&root,
               (unsigned_long *)&reader);
    kj::_::Debug::Fault::fatal(&f);
  }
  segments = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,segments,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&reader.super_MessageReader);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (root._reader.pointerCount != 0) {
    f.exception._0_4_ = root._reader.segment._0_4_;
    f.exception._4_4_ = root._reader.segment._4_4_;
  }
  AnyPointer::Reader::
  getAs<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>,(capnp::Kind)6>>
            (&listListReader,(Reader *)&f);
  local_408._vptr_Runnable = (_func_int **)&PTR_run_003923f0;
  local_400 = &listListReader;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&f,&local_408);
  cVar2 = (char)f.exception;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x612,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr\""
               ,(char (*) [84])
                "failed: expected kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr"
              );
  }
  local_408._vptr_Runnable = (_func_int **)&PTR_run_00392420;
  local_400 = &listListReader;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&f,&local_408);
  cVar2 = (char)f.exception;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[85]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x613,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr\""
               ,(char (*) [85])
                "failed: expected kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr"
              );
  }
  sVar1 = (AVar4.ptr)->size_;
  MVar5 = StructReader::totalSize(&root._reader);
  if ((sVar1 - 1 != MVar5.wordCount) && (kj::_::Debug::minSeverity < 3)) {
    local_408._vptr_Runnable = (_func_int **)((AVar4.ptr)->size_ - 1);
    MVar5 = StructReader::totalSize(&root._reader);
    f.exception = (Exception *)MVar5.wordCount;
    kj::_::Debug::log<char_const(&)[74],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x615,ERROR,
               "\"failed: expected \" \"(segments[0].size() - 1) == (root.totalSize().wordCount)\", segments[0].size() - 1, root.totalSize().wordCount"
               ,(char (*) [74])
                "failed: expected (segments[0].size() - 1) == (root.totalSize().wordCount)",
               (unsigned_long *)&local_408,(unsigned_long *)&f);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, EmptyStructListAmplification) {
  MallocMessageBuilder builder(1024);
  auto listList = builder.initRoot<test::TestAnyPointer>().getAnyPointerField()
      .initAs<List<List<test::TestEmptyStruct>>>(500);

  for (uint i = 0; i < listList.size(); i++) {
    listList.init(i, 1u << 28);
  }

  auto segments = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segments.size());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>();
  auto listListReader = root.getAnyPointerField().getAs<List<List<TestAllTypes>>>();
  EXPECT_NONFATAL_FAILURE(listListReader[0]);
  EXPECT_NONFATAL_FAILURE(listListReader[10]);

  EXPECT_EQ(segments[0].size() - 1, root.totalSize().wordCount);
}